

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O3

void __thiscall Adjacency_Subgraph_degree_Test::TestBody(Adjacency_Subgraph_degree_Test *this)

{
  Adjacency_Graph<false> *this_00;
  char *pcVar1;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  Adjacency_Graph<false> graph;
  Adjacency_Subgraph subgraph;
  AssertHelper local_130;
  int local_124;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_120;
  undefined1 local_108 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  Adjacency_Graph<false> local_a0;
  Adjacency_Subgraph local_70;
  
  Disa::create_graph_structured<false>(&local_a0,3);
  vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000004;
  vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000005;
  local_108 = (undefined1  [8])0x1;
  vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000007;
  __l._M_len = 5;
  __l._M_array = (iterator)local_108;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_120,__l,(allocator_type *)&local_130);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph(&local_70,&local_a0,&local_120,0);
  if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)0x0;
  this_00 = &local_70.graph;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(0)","1",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x128,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)0x1;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(1)","1",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x129,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)0x2;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(2)","4",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x12a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)0x3;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(3)","1",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,299,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)&DAT_00000004;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(4)","1",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,300,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)&DAT_00000004;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_130;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_120,__l_00,(allocator_type *)&local_124);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_108,&local_a0,&local_120,1);
  local_70.hash_parent = (size_t)local_108;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this_00->vertex_adjacent_list,&vStack_100);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_70.graph.offset,&local_e8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_70.i_local_global,&local_d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_70.level_set_value,&local_b8);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_108);
  if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)0x0;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(0)","4",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x130,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)0x1;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(1)","1",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x131,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)0x2;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(2)","1",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x132,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)0x3;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(3)","1",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x133,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.data_ = (AssertHelperData *)&DAT_00000004;
  local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Graph<false>::degree(this_00,(size_t *)&local_130);
  local_124 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"subgraph.degree(4)","1",(unsigned_long *)&local_120,&local_124);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)
               vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x134,pcVar1);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_120.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_100.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_70);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_a0);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, degree) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);

  // Test degree on primary subgraph.
  Adjacency_Subgraph subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_EQ(subgraph.degree(0), 1);
  EXPECT_EQ(subgraph.degree(1), 1);
  EXPECT_EQ(subgraph.degree(2), 4);
  EXPECT_EQ(subgraph.degree(3), 1);
  EXPECT_EQ(subgraph.degree(4), 1);

  // Test degree on both level and primary parts of the subgraph.
  subgraph = Adjacency_Subgraph(graph, {4}, 1);
  EXPECT_EQ(subgraph.degree(0), 4);
  EXPECT_EQ(subgraph.degree(1), 1);
  EXPECT_EQ(subgraph.degree(2), 1);
  EXPECT_EQ(subgraph.degree(3), 1);
  EXPECT_EQ(subgraph.degree(4), 1);
}